

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::_::Tuple<>_> __thiscall
kj::parse::NotLookingAt_<kj::parse::CharGroup_>::operator()
          (NotLookingAt_<kj::parse::CharGroup_> *this,ParserInput *input)

{
  bool bVar1;
  ParserInput *in_RDX;
  Tuple<> local_57;
  undefined1 local_56 [22];
  ParserInput subInput;
  ParserInput *input_local;
  NotLookingAt_<kj::parse::CharGroup_> *this_local;
  
  capnp::compiler::Lexer::ParserInput::ParserInput((ParserInput *)(local_56 + 0xe),in_RDX);
  IteratorInput<char,_const_char_*>::forgetParent
            ((IteratorInput<char,_const_char_*> *)(local_56 + 0xe));
  CharGroup_::operator()((CharGroup_ *)local_56,input);
  bVar1 = Maybe<char>::operator==((Maybe<char> *)local_56,(void *)0x0);
  Maybe<char>::~Maybe((Maybe<char> *)local_56);
  if (bVar1) {
    Maybe<kj::_::Tuple<>_>::Maybe((Maybe<kj::_::Tuple<>_> *)this,&local_57);
  }
  else {
    Maybe<kj::_::Tuple<>_>::Maybe((Maybe<kj::_::Tuple<>_> *)this,(void *)0x0);
  }
  capnp::compiler::Lexer::ParserInput::~ParserInput((ParserInput *)(local_56 + 0xe));
  return (Maybe<kj::_::Tuple<>_>)SUB82(this,0);
}

Assistant:

Maybe<Tuple<>> operator()(Input& input) const {
    Input subInput(input);
    subInput.forgetParent();
    if (subParser(subInput) == nullptr) {
      return Tuple<>();
    } else {
      return nullptr;
    }
  }